

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverPSOR.cpp
# Opt level: O3

double __thiscall chrono::ChSolverPSOR::Solve(ChSolverPSOR *this,ChSystemDescriptor *sysd)

{
  int *piVar1;
  pointer ppCVar2;
  ChConstraint *pCVar3;
  ChVariables *this_00;
  ChConstraint *pCVar4;
  ChConstraint *pCVar5;
  bool bVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  pointer ppCVar14;
  pointer ppCVar15;
  ulong uVar16;
  pointer ppCVar17;
  pointer ppCVar18;
  int iVar19;
  ulong uVar20;
  uint iternum;
  ulong uVar21;
  int iVar22;
  uint uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  double dVar32;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  double dVar33;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  double gi_values [3];
  double old_lambda_friction [3];
  undefined1 local_118 [16];
  undefined1 local_f8 [16];
  double local_e8 [4];
  double local_c8 [3];
  long local_b0;
  long local_a8;
  long local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  double local_78;
  undefined8 uStack_70;
  ChVectorRef local_60;
  ChVectorRef local_48;
  
  (this->super_ChIterativeSolverVI).m_iterations = 0;
  this->maxviolation = 0.0;
  ppCVar15 = (sysd->vconstraints).
             super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((sysd->vconstraints).
      super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>._M_impl.
      super__Vector_impl_data._M_finish == ppCVar15) {
    uVar16 = 0;
  }
  else {
    uVar20 = 0;
    uVar21 = 1;
    do {
      (*ppCVar15[uVar20]->_vptr_ChConstraint[6])();
      ppCVar15 = (sysd->vconstraints).
                 super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      uVar16 = (long)(sysd->vconstraints).
                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar15 >> 3;
      bVar6 = uVar21 < uVar16;
      uVar20 = uVar21;
      uVar21 = (ulong)((int)uVar21 + 1);
    } while (bVar6);
  }
  if (uVar16 != 0) {
    iVar22 = 0;
    uVar20 = 1;
    ppCVar18 = ppCVar15;
    do {
      pCVar3 = *ppCVar18;
      iVar19 = (int)uVar20;
      if (pCVar3->mode == CONSTRAINT_FRIC) {
        local_e8[iVar22] = pCVar3->g_i;
        iVar22 = iVar22 + 1;
        if (iVar22 == 3) {
          dVar32 = (local_e8[0] + local_e8[1] + local_e8[2]) / 3.0;
          ppCVar15[iVar19 - 3]->g_i = dVar32;
          ppCVar15[iVar19 - 2]->g_i = dVar32;
          iVar22 = 0;
          pCVar3->g_i = dVar32;
        }
      }
      ppCVar18 = ppCVar18 + 1;
      bVar6 = uVar20 < uVar16;
      uVar20 = (ulong)(iVar19 + 1);
    } while (bVar6);
  }
  ppCVar14 = (sysd->vvariables).
             super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppCVar17 = (sysd->vvariables).
             super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar17 != ppCVar14) {
    uVar16 = 1;
    uVar20 = 0;
    do {
      uVar21 = uVar16;
      this_00 = ppCVar14[uVar20];
      if (this_00->disabled == false) {
        ChVariables::Get_qb(&local_48,this_00);
        ChVariables::Get_fb(&local_60,
                            (sysd->vvariables).
                            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar20]);
        local_98 = 0;
        uStack_90 = 0;
        local_b0 = local_60.
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   ._0_8_;
        local_a8 = local_60.
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   ._8_8_;
        if ((long)local_60.
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                  ._8_8_ < 0 &&
            local_60.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._0_8_ != 0) {
          __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                        ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                        "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
                       );
        }
        (*this_00->_vptr_ChVariables[4])(this_00,&local_48,&local_b0);
        if (local_98 != 0) {
          free(*(void **)(local_98 + -8));
        }
        ppCVar14 = (sysd->vvariables).
                   super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppCVar17 = (sysd->vvariables).
                   super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar16 = (ulong)((int)uVar21 + 1);
      uVar20 = uVar21;
    } while (uVar21 < (ulong)((long)ppCVar17 - (long)ppCVar14 >> 3));
  }
  ppCVar15 = (sysd->vconstraints).
             super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppCVar18 = (sysd->vconstraints).
             super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_warm_start == false) {
    if ((long)ppCVar18 - (long)ppCVar15 != 0) {
      uVar16 = 0;
      do {
        ppCVar2 = ppCVar15 + uVar16;
        uVar16 = uVar16 + 1;
        (*ppCVar2)->l_i = 0.0;
      } while ((uVar16 & 0xffffffff) < (ulong)((long)ppCVar18 - (long)ppCVar15 >> 3));
    }
  }
  else if (ppCVar18 != ppCVar15) {
    uVar16 = 0;
    uVar20 = 1;
    do {
      pCVar3 = ppCVar15[uVar16];
      if (pCVar3->active == true) {
        (*pCVar3->_vptr_ChConstraint[8])(pCVar3->l_i);
        ppCVar15 = (sysd->vconstraints).
                   super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppCVar18 = (sysd->vconstraints).
                   super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      }
      bVar6 = uVar20 < (ulong)((long)ppCVar18 - (long)ppCVar15 >> 3);
      uVar16 = uVar20;
      uVar20 = (ulong)((int)uVar20 + 1);
    } while (bVar6);
  }
  if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_max_iterations < 1) {
    dVar32 = this->maxviolation;
  }
  else {
    iternum = 0;
    local_88 = 0x7fffffffffffffff;
    uStack_80 = 0x7fffffffffffffff;
    do {
      this->maxviolation = 0.0;
      auVar31 = ZEXT864(0) << 0x40;
      dVar32 = 0.0;
      ppCVar15 = (sysd->vconstraints).
                 super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppCVar18 = (sysd->vconstraints).
                 super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      local_f8._0_8_ = 0.0;
      if (ppCVar18 != ppCVar15) {
        uVar23 = 1;
        uVar16 = 0;
        iVar22 = 0;
        local_f8 = ZEXT816(0);
        do {
          dVar32 = auVar31._0_8_;
          if (ppCVar15[uVar16]->active == true) {
            (*ppCVar15[uVar16]->_vptr_ChConstraint[7])();
            pCVar3 = (sysd->vconstraints).
                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16];
            auVar27._8_8_ = 0;
            auVar27._0_8_ = pCVar3->cfm_i;
            auVar25._8_8_ = 0;
            auVar25._0_8_ = pCVar3->l_i;
            auVar34._8_8_ = 0;
            auVar34._0_8_ = dVar32 + pCVar3->b_i;
            auVar25 = vfmadd132sd_fma(auVar27,auVar34,auVar25);
            auVar27 = auVar25;
            (*pCVar3->_vptr_ChConstraint[0xc])();
            ppCVar15 = (sysd->vconstraints).
                       super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            pCVar3 = ppCVar15[uVar16];
            auVar24._8_8_ = 0x8000000000000000;
            auVar24._0_8_ = 0x8000000000000000;
            auVar24 = vxorpd_avx512vl(auVar25,auVar24);
            dVar32 = pCVar3->l_i;
            dVar33 = ((this->super_ChIterativeSolverVI).m_omega / pCVar3->g_i) * auVar24._0_8_ +
                     dVar32;
            if (pCVar3->mode == CONSTRAINT_FRIC) {
              local_c8[iVar22] = dVar32;
              pCVar3->l_i = dVar33;
              if (iVar22 == 0) {
                auVar8._8_8_ = 0x7fffffffffffffff;
                auVar8._0_8_ = 0x7fffffffffffffff;
                auVar24 = vandpd_avx512vl(auVar25,auVar8);
                iVar22 = 1;
                uVar7 = vcmpsd_avx512f(ZEXT816(0) << 0x40,auVar25,1);
                auVar36._8_8_ = auVar24._8_8_;
                auVar36._0_8_ = (ulong)!(bool)((byte)uVar7 & 1) * auVar24._0_8_;
              }
              else {
                iVar22 = iVar22 + 1;
                auVar36 = ZEXT816(0);
                if (iVar22 == 3) {
                  (*ppCVar15[uVar23 - 3]->_vptr_ChConstraint[0xb])();
                  ppCVar15 = (sysd->vconstraints).
                             super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  dVar32 = (this->super_ChIterativeSolverVI).m_shlambda;
                  auVar41._8_8_ = 0;
                  auVar41._0_8_ = dVar32;
                  pCVar3 = ppCVar15[uVar23 - 3];
                  pCVar4 = ppCVar15[uVar23 - 2];
                  pCVar5 = ppCVar15[uVar16];
                  local_78 = pCVar3->l_i;
                  auVar28._8_8_ = 0;
                  auVar28._0_8_ = local_78;
                  dVar33 = pCVar4->l_i;
                  auVar35._8_8_ = 0;
                  auVar35._0_8_ = dVar33;
                  local_118._0_8_ = pCVar5->l_i;
                  auVar39._8_8_ = 0;
                  auVar39._0_8_ = local_118._0_8_;
                  if ((dVar32 != 1.0) || (NAN(dVar32))) {
                    dVar32 = 1.0 - dVar32;
                    auVar43._8_8_ = 0;
                    auVar43._0_8_ = dVar32 * local_c8[0];
                    auVar25 = vfmadd213sd_fma(auVar28,auVar41,auVar43);
                    auVar44._8_8_ = 0;
                    auVar44._0_8_ = dVar32 * local_c8[1];
                    auVar24 = vfmadd213sd_fma(auVar35,auVar41,auVar44);
                    dVar33 = auVar24._0_8_;
                    auVar42._8_8_ = 0;
                    auVar42._0_8_ = dVar32 * local_c8[2];
                    auVar24 = vfmadd213sd_fma(auVar39,auVar41,auVar42);
                    local_78 = auVar25._0_8_;
                    pCVar3->l_i = local_78;
                    pCVar4->l_i = dVar33;
                    local_118._0_8_ = auVar24._0_8_;
                    pCVar5->l_i = (double)local_118._0_8_;
                  }
                  dVar33 = dVar33 - local_c8[1];
                  local_78 = local_78 - local_c8[0];
                  local_118._0_8_ = (double)local_118._0_8_ - local_c8[2];
                  uStack_70 = 0;
                  local_118._8_8_ = 0;
                  (*pCVar3->_vptr_ChConstraint[8])();
                  (*(sysd->vconstraints).
                    super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar23 - 2]->_vptr_ChConstraint[8])
                            (dVar33);
                  (*(sysd->vconstraints).
                    super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar16]->_vptr_ChConstraint[8])
                            (local_118._0_8_);
                  iVar22 = 0;
                  if ((this->super_ChIterativeSolverVI).record_violation_history == true) {
                    auVar12._8_8_ = uStack_80;
                    auVar12._0_8_ = local_88;
                    auVar13._8_8_ = uStack_70;
                    auVar13._0_8_ = local_78;
                    auVar25 = vandpd_avx(auVar12,auVar13);
                    auVar24 = vmaxsd_avx(local_f8,auVar25);
                    auVar10._8_8_ = 0;
                    auVar10._0_8_ = dVar33;
                    auVar25 = vandpd_avx(auVar12,auVar10);
                    auVar24 = vmaxsd_avx(auVar24,auVar25);
                    auVar25 = vandpd_avx(auVar12,local_118);
                    local_f8 = vmaxsd_avx(auVar24,auVar25);
                  }
                  auVar36 = SUB6416(ZEXT864(0),0) << 0x40;
                }
              }
            }
            else {
              pCVar3->l_i = dVar33;
              (*pCVar3->_vptr_ChConstraint[0xb])();
              dVar33 = (this->super_ChIterativeSolverVI).m_shlambda;
              auVar37._8_8_ = 0;
              auVar37._0_8_ = dVar33;
              pCVar3 = (sysd->vconstraints).
                       super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar16];
              dVar26 = pCVar3->l_i;
              auVar29._8_8_ = 0;
              auVar29._0_8_ = dVar26;
              if ((dVar33 != 1.0) || (NAN(dVar33))) {
                auVar40._8_8_ = 0;
                auVar40._0_8_ = dVar32 * (1.0 - dVar33);
                auVar25 = vfmadd213sd_fma(auVar29,auVar37,auVar40);
                dVar26 = auVar25._0_8_;
                pCVar3->l_i = dVar26;
              }
              auVar38._8_8_ = 0x7fffffffffffffff;
              auVar38._0_8_ = 0x7fffffffffffffff;
              auVar36 = vandpd_avx(auVar38,auVar27);
              (*pCVar3->_vptr_ChConstraint[8])();
              if ((this->super_ChIterativeSolverVI).record_violation_history == true) {
                auVar11._8_8_ = 0;
                auVar11._0_8_ = dVar26 - dVar32;
                auVar9._8_8_ = 0x7fffffffffffffff;
                auVar9._0_8_ = 0x7fffffffffffffff;
                auVar25 = vandpd_avx512vl(auVar11,auVar9);
                local_f8 = vmaxsd_avx(local_f8,auVar25);
              }
            }
            auVar30._8_8_ = 0;
            auVar30._0_8_ = this->maxviolation;
            auVar25 = vmaxsd_avx(auVar30,auVar36);
            auVar31 = ZEXT1664(auVar25);
            this->maxviolation = auVar25._0_8_;
            ppCVar15 = (sysd->vconstraints).
                       super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            ppCVar18 = (sysd->vconstraints).
                       super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
          }
          dVar32 = auVar31._0_8_;
          uVar16 = (ulong)uVar23;
          uVar23 = uVar23 + 1;
        } while (uVar16 < (ulong)((long)ppCVar18 - (long)ppCVar15 >> 3));
      }
      if ((this->super_ChIterativeSolverVI).record_violation_history != false) {
        ChIterativeSolverVI::AtIterationEnd
                  (&this->super_ChIterativeSolverVI,dVar32,(double)local_f8._0_8_,iternum);
        dVar32 = this->maxviolation;
      }
      piVar1 = &(this->super_ChIterativeSolverVI).m_iterations;
      *piVar1 = *piVar1 + 1;
    } while (((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_tolerance <= dVar32) &&
            (iternum = iternum + 1,
            (int)iternum <
            (this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_max_iterations));
  }
  return dVar32;
}

Assistant:

double ChSolverPSOR::Solve(ChSystemDescriptor& sysd) {
    std::vector<ChConstraint*>& mconstraints = sysd.GetConstraintsList();
    std::vector<ChVariables*>& mvariables = sysd.GetVariablesList();

    m_iterations = 0;
    maxviolation = 0;
    double maxdeltalambda = 0.;
    int i_friction_comp = 0;
    double old_lambda_friction[3];

    // 1)  Update auxiliary data in all constraints before starting,
    //     that is: g_i=[Cq_i]*[invM_i]*[Cq_i]' and  [Eq_i]=[invM_i]*[Cq_i]'
    for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
        mconstraints[ic]->Update_auxiliary();

    // Average all g_i for the triplet of contact constraints n,u,v.
    //
    int j_friction_comp = 0;
    double gi_values[3];
    for (unsigned int ic = 0; ic < mconstraints.size(); ic++) {
        if (mconstraints[ic]->GetMode() == CONSTRAINT_FRIC) {
            gi_values[j_friction_comp] = mconstraints[ic]->Get_g_i();
            j_friction_comp++;
            if (j_friction_comp == 3) {
                double average_g_i = (gi_values[0] + gi_values[1] + gi_values[2]) / 3.0;
                mconstraints[ic - 2]->Set_g_i(average_g_i);
                mconstraints[ic - 1]->Set_g_i(average_g_i);
                mconstraints[ic - 0]->Set_g_i(average_g_i);
                j_friction_comp = 0;
            }
        }
    }

    // 2)  Compute, for all items with variables, the initial guess for
    //     still unconstrained system:

    for (unsigned int iv = 0; iv < mvariables.size(); iv++) {
        if (mvariables[iv]->IsActive())
            mvariables[iv]->Compute_invMb_v(mvariables[iv]->Get_qb(), mvariables[iv]->Get_fb());  // q = [M]'*fb
    }

    // 3)  For all items with variables, add the effect of initial (guessed)
    //     lagrangian reactions of constraints, if a warm start is desired.
    //     Otherwise, if no warm start, simply resets initial lagrangians to zero.
    if (m_warm_start) {
        for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
            if (mconstraints[ic]->IsActive())
                mconstraints[ic]->Increment_q(mconstraints[ic]->Get_l_i());
    } else {
        for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
            mconstraints[ic]->Set_l_i(0.);
    }

    // 4)  Perform the iteration loops
    //

    for (int iter = 0; iter < m_max_iterations; iter++) {
        // The iteration on all constraints
        //

        maxviolation = 0;
        maxdeltalambda = 0;
        i_friction_comp = 0;

        for (unsigned int ic = 0; ic < mconstraints.size(); ic++) {
            // skip computations if constraint not active.
            if (mconstraints[ic]->IsActive()) {
                // compute residual  c_i = [Cq_i]*q + b_i + cfm_i*l_i
                double mresidual = mconstraints[ic]->Compute_Cq_q() + mconstraints[ic]->Get_b_i() +
                                   mconstraints[ic]->Get_cfm_i() * mconstraints[ic]->Get_l_i();

                // true constraint violation may be different from 'mresidual' (ex:clamped if unilateral)
                double candidate_violation = fabs(mconstraints[ic]->Violation(mresidual));

                // compute:  delta_lambda = -(omega/g_i) * ([Cq_i]*q + b_i + cfm_i*l_i )
                double deltal = (m_omega / mconstraints[ic]->Get_g_i()) * (-mresidual);

                if (mconstraints[ic]->GetMode() == CONSTRAINT_FRIC) {
                    candidate_violation = 0;

                    // update:   lambda += delta_lambda;
                    old_lambda_friction[i_friction_comp] = mconstraints[ic]->Get_l_i();
                    mconstraints[ic]->Set_l_i(old_lambda_friction[i_friction_comp] + deltal);
                    i_friction_comp++;

                    if (i_friction_comp == 1)
                        candidate_violation = fabs(ChMin(0.0, mresidual));

                    if (i_friction_comp == 3) {
                        mconstraints[ic - 2]->Project();  // the N normal component will take care of N,U,V
                        double new_lambda_0 = mconstraints[ic - 2]->Get_l_i();
                        double new_lambda_1 = mconstraints[ic - 1]->Get_l_i();
                        double new_lambda_2 = mconstraints[ic - 0]->Get_l_i();
                        // Apply the smoothing: lambda= sharpness*lambda_new_projected + (1-sharpness)*lambda_old
                        if (m_shlambda != 1.0) {
                            new_lambda_0 = m_shlambda * new_lambda_0 + (1.0 - m_shlambda) * old_lambda_friction[0];
                            new_lambda_1 = m_shlambda * new_lambda_1 + (1.0 - m_shlambda) * old_lambda_friction[1];
                            new_lambda_2 = m_shlambda * new_lambda_2 + (1.0 - m_shlambda) * old_lambda_friction[2];
                            mconstraints[ic - 2]->Set_l_i(new_lambda_0);
                            mconstraints[ic - 1]->Set_l_i(new_lambda_1);
                            mconstraints[ic - 0]->Set_l_i(new_lambda_2);
                        }
                        double true_delta_0 = new_lambda_0 - old_lambda_friction[0];
                        double true_delta_1 = new_lambda_1 - old_lambda_friction[1];
                        double true_delta_2 = new_lambda_2 - old_lambda_friction[2];
                        mconstraints[ic - 2]->Increment_q(true_delta_0);
                        mconstraints[ic - 1]->Increment_q(true_delta_1);
                        mconstraints[ic - 0]->Increment_q(true_delta_2);

                        if (this->record_violation_history) {
                            maxdeltalambda = ChMax(maxdeltalambda, fabs(true_delta_0));
                            maxdeltalambda = ChMax(maxdeltalambda, fabs(true_delta_1));
                            maxdeltalambda = ChMax(maxdeltalambda, fabs(true_delta_2));
                        }
                        i_friction_comp = 0;
                    }
                } else {
                    // update:   lambda += delta_lambda;
                    double old_lambda = mconstraints[ic]->Get_l_i();
                    mconstraints[ic]->Set_l_i(old_lambda + deltal);

                    // If new lagrangian multiplier does not satisfy inequalities, project
                    // it into an admissible orthant (or, in general, onto an admissible set)
                    mconstraints[ic]->Project();

                    // After projection, the lambda may have changed a bit..
                    double new_lambda = mconstraints[ic]->Get_l_i();

                    // Apply the smoothing: lambda= sharpness*lambda_new_projected + (1-sharpness)*lambda_old
                    if (m_shlambda != 1.0) {
                        new_lambda = m_shlambda * new_lambda + (1.0 - m_shlambda) * old_lambda;
                        mconstraints[ic]->Set_l_i(new_lambda);
                    }

                    double true_delta = new_lambda - old_lambda;

                    // For all items with variables, add the effect of incremented
                    // (and projected) lagrangian reactions:
                    mconstraints[ic]->Increment_q(true_delta);

                    if (this->record_violation_history)
                        maxdeltalambda = ChMax(maxdeltalambda, fabs(true_delta));
                }

                maxviolation = ChMax(maxviolation, fabs(candidate_violation));

            }  // end IsActive()

        }  // end loop on constraints

        // For recording into violation history, if debugging
        if (this->record_violation_history)
            AtIterationEnd(maxviolation, maxdeltalambda, iter);

        m_iterations++;

        // Terminate the loop if violation in constraints has been successfully limited.
        if (maxviolation < m_tolerance)
            break;

    }  // end iteration loop

    return maxviolation;
}